

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>_>::
int_writer<int,_fmt::v6::basic_format_specs<wchar_t>_>::on_oct
          (int_writer<int,_fmt::v6::basic_format_specs<wchar_t>_> *this)

{
  uint uVar1;
  int iVar2;
  long in_RDI;
  string_view sVar3;
  format_specs in_stack_00000000;
  int num_digits;
  undefined1 local_48 [28];
  int in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  bin_writer<3> f;
  size_t sVar4;
  undefined4 in_stack_fffffffffffffff0;
  
  iVar2 = count_digits<3u,unsigned_int>(*(uint *)(in_RDI + 0x10));
  if (((*(char *)(*(long *)(in_RDI + 8) + 9) < '\0') &&
      (*(int *)(*(long *)(in_RDI + 8) + 4) <= iVar2)) && (*(int *)(in_RDI + 0x10) != 0)) {
    uVar1 = *(uint *)(in_RDI + 0x18);
    *(uint *)(in_RDI + 0x18) = uVar1 + 1;
    *(undefined1 *)(in_RDI + 0x14 + (ulong)uVar1) = 0x30;
  }
  sVar3 = get_prefix((int_writer<int,_fmt::v6::basic_format_specs<wchar_t>_> *)0x1ae6b4);
  f = (bin_writer<3>)sVar3.data_;
  sVar4 = sVar3.size_;
  memcpy(local_48,*(void **)(in_RDI + 8),0x24);
  sVar3.size_._0_4_ = in_stack_fffffffffffffff0;
  sVar3.data_ = (char *)sVar4;
  sVar3.size_._4_4_ = iVar2;
  basic_writer<fmt::v6::buffer_range<wchar_t>>::
  write_int<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::int_writer<int,fmt::v6::basic_format_specs<wchar_t>>::bin_writer<3>>
            ((basic_writer<fmt::v6::buffer_range<wchar_t>_> *)
             CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),in_stack_ffffffffffffffd4
             ,sVar3,in_stack_00000000,f);
  return;
}

Assistant:

void on_oct() {
      int num_digits = count_digits<3>(abs_value);
      if (specs.alt && specs.precision <= num_digits && abs_value != 0) {
        // Octal prefix '0' is counted as a digit, so only add it if precision
        // is not greater than the number of digits.
        prefix[prefix_size++] = '0';
      }
      writer.write_int(num_digits, get_prefix(), specs,
                       bin_writer<3>{abs_value, num_digits});
    }